

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O3

void __thiscall KDIS::PDU::TSPI_PDU::Decode(TSPI_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator __position;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  byte bVar5;
  KOCTET tmp;
  KString local_50;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x18 < iVar4 + (uint)KVar3) {
    pcVar2 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_finish != pcVar2) {
      (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish = pcVar2;
    }
    LE_Header::Decode(&this->super_LE_Header,stream,ignoreHeader);
    KDataStream::Read(stream,&(this->m_TSPIFlagUnion).m_ui8Flag);
    (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Loc,stream);
    bVar5 = (this->m_TSPIFlagUnion).m_ui8Flag;
    if ((bVar5 & 1) != 0) {
      (*(this->m_LinVel).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_LinVel,stream);
      bVar5 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar5 & 2) != 0) {
      (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
      bVar5 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar5 & 4) != 0) {
      (*(this->m_PosErr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_PosErr,stream);
      bVar5 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar5 & 8) != 0) {
      (*(this->m_OriErr).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_OriErr,stream);
      bVar5 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar5 & 0x10) != 0) {
      (*(this->m_DeadReckoningParameter).super_DataTypeBase._vptr_DataTypeBase[3])
                (&this->m_DeadReckoningParameter,stream);
      bVar5 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar5 & 0x20) != 0) {
      (*(this->m_MeasureSpd).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_MeasureSpd,stream);
      bVar5 = (this->m_TSPIFlagUnion).m_ui8Flag;
    }
    if ((bVar5 & 0x40) != 0) {
      KDataStream::Read(stream,&this->m_ui8SSDLen);
      if (this->m_ui8SSDLen != '\0') {
        bVar5 = 0;
        do {
          KDataStream::Read(stream,(KOCTET *)&local_50);
          __position._M_current =
               (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                      ((vector<char,std::allocator<char>> *)&this->m_vSSD,__position,
                       (char *)&local_50);
          }
          else {
            *__position._M_current = (char)local_50._M_dataplus._M_p;
            ppcVar1 = &(this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          bVar5 = bVar5 + 1;
        } while (bVar5 < this->m_ui8SSDLen);
      }
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
  KException::KException(this_00,&local_50,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void TSPI_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < TSPI_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vSSD.clear();

    LE_Header::Decode( stream, ignoreHeader );

    stream >> m_TSPIFlagUnion.m_ui8Flag
           >> KDIS_STREAM m_Loc;

    if( m_TSPIFlagUnion.m_ui8LinVel )
    {
        stream >> KDIS_STREAM m_LinVel;
    }

    if( m_TSPIFlagUnion.m_ui8Ori )
    {
        stream >> KDIS_STREAM m_Ori;
    }

    if( m_TSPIFlagUnion.m_ui8PosErr )
    {
        stream >> KDIS_STREAM m_PosErr;
    }

    if( m_TSPIFlagUnion.m_ui8OriErr )
    {
        stream >> KDIS_STREAM m_OriErr;
    }

    if( m_TSPIFlagUnion.m_ui8DRM )
    {
        stream >> KDIS_STREAM m_DeadReckoningParameter;
    }

    if( m_TSPIFlagUnion.m_ui8Spd )
    {
        stream >> KDIS_STREAM m_MeasureSpd;
    }

    if( m_TSPIFlagUnion.m_ui8Data )
    {
        stream >> m_ui8SSDLen;

        // Decode System Specific Data
        KOCTET tmp;
        for( KUINT8 i = 0; i < m_ui8SSDLen; ++i )
        {
            stream >> tmp;
            m_vSSD.push_back( tmp );
        }
    }
}